

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_generic.c
# Opt level: O0

void gf_25519_sub(gf_25519_s *d,gf_25519_s *a,gf_25519_s *b)

{
  ulong uVar1;
  gf_25519_s *b_local;
  gf_25519_s *a_local;
  gf_25519_s *d_local;
  uint i_2;
  uint64_t tmp;
  uint64_t mask;
  uint i;
  uint i_1;
  
  for (i = 0; i < 5; i = i + 1) {
    d->limb[i] = a->limb[i] - b->limb[i];
  }
  d->limb[0] = d->limb[0] + 0x1fffffffffffb4;
  for (i_1 = 1; i_1 < 5; i_1 = i_1 + 1) {
    d->limb[i_1] = d->limb[i_1] + 0x1ffffffffffffc;
  }
  uVar1 = d->limb[4];
  for (i_2 = 4; i_2 != 0; i_2 = i_2 - 1) {
    d->limb[i_2] = (d->limb[i_2] & 0x7ffffffffffff) + (d->limb[i_2 - 1] >> 0x33);
  }
  d->limb[0] = (d->limb[0] & 0x7ffffffffffff) + (uVar1 >> 0x33) * 0x13;
  return;
}

Assistant:

void gf_sub (gf d, const gf a, const gf b) {
    gf_sub_RAW ( d, a, b );
    gf_bias( d, 2 );
    gf_weak_reduce ( d );
}